

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrimitiveArrayObject.cpp
# Opt level: O0

string * __thiscall
PrimitiveArrayObject::GetTypename_abi_cxx11_
          (string *__return_storage_ptr__,PrimitiveArrayObject *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  PrimitiveArrayObject *local_18;
  PrimitiveArrayObject *this_local;
  
  local_18 = this;
  this_local = (PrimitiveArrayObject *)__return_storage_ptr__;
  (**(this->simple_object_->super_PrimitiveObject).super_Object._vptr_Object)();
  std::operator+(__return_storage_ptr__,&local_38,"[]");
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string PrimitiveArrayObject::GetTypename() {
  return simple_object_->GetTypename() + "[]";
}